

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O1

REF_STATUS ref_dict_deep_copy(REF_DICT *ref_dict_ptr,REF_DICT original)

{
  int iVar1;
  int iVar2;
  REF_DICT pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_INT RVar6;
  undefined8 uVar7;
  REF_INT RVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  size_t __size;
  bool bVar12;
  
  pRVar3 = (REF_DICT)malloc(0x20);
  *ref_dict_ptr = pRVar3;
  if (pRVar3 == (REF_DICT)0x0) {
    pcVar10 = "malloc *ref_dict_ptr of REF_DICT_STRUCT NULL";
    uVar7 = 0x39;
  }
  else {
    iVar1 = original->n;
    pRVar3->n = iVar1;
    iVar2 = original->max;
    pRVar3->max = iVar2;
    if ((long)iVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x40,
             "ref_dict_deep_copy","malloc ref_dict->key of REF_INT negative");
      return 1;
    }
    __size = (long)iVar2 << 2;
    pRVar4 = (REF_INT *)malloc(__size);
    pRVar3->key = pRVar4;
    if (pRVar4 == (REF_INT *)0x0) {
      pcVar10 = "malloc ref_dict->key of REF_INT NULL";
      uVar7 = 0x40;
    }
    else {
      pRVar5 = (REF_INT *)malloc(__size);
      pRVar3->value = pRVar5;
      if (pRVar5 != (REF_INT *)0x0) {
        RVar6 = -1;
        RVar8 = -1;
        if (0 < iVar1) {
          RVar8 = *original->key;
          RVar6 = *original->value;
        }
        uVar9 = (ulong)original->n;
        if ((long)uVar9 < 1) {
          return 0;
        }
        uVar11 = 1;
        do {
          pRVar4[uVar11 - 1] = RVar8;
          pRVar5[uVar11 - 1] = RVar6;
          RVar6 = -1;
          RVar8 = -1;
          if (uVar11 < uVar9) {
            RVar8 = original->key[uVar11];
            RVar6 = original->value[uVar11];
          }
          bVar12 = uVar11 != uVar9;
          uVar11 = uVar11 + 1;
        } while (bVar12);
        return 0;
      }
      pcVar10 = "malloc ref_dict->value of REF_INT NULL";
      uVar7 = 0x41;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uVar7,
         "ref_dict_deep_copy",pcVar10);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_dict_deep_copy(REF_DICT *ref_dict_ptr,
                                      REF_DICT original) {
  REF_DICT ref_dict;
  REF_INT key_index, dict_key, dict_value;

  ref_malloc(*ref_dict_ptr, 1, REF_DICT_STRUCT);

  ref_dict = (*ref_dict_ptr);

  ref_dict_n(ref_dict) = ref_dict_n(original);
  ref_dict_max(ref_dict) = ref_dict_max(original);

  ref_malloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
  ref_malloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);

  each_ref_dict_key_value(original, key_index, dict_key, dict_value) {
    ref_dict_key(ref_dict, key_index) = dict_key;
    ref_dict_keyvalue(ref_dict, key_index) = dict_value;
  }

  return REF_SUCCESS;
}